

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadAnimation(ColladaParser *this,Animation *pParent)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  Animation *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar7;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var8;
  mapped_type *ppAVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_bool>
  pVar10;
  Animation *anim;
  Animation *local_270;
  uint local_264;
  string animName;
  string animID;
  ChannelMap channels;
  AnimationChannel local_1f0;
  string id;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>
  local_110;
  
  local_270 = pParent;
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar4 != '\0') {
    return;
  }
  p_Var1 = &channels._M_t._M_impl.super__Rb_tree_header;
  channels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  channels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  channels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anim = (Animation *)0x0;
  animName._M_dataplus._M_p = (pointer)&animName.field_2;
  animName._M_string_length = 0;
  animName.field_2._M_local_buf[0] = '\0';
  animID._M_dataplus._M_p = (pointer)&animID.field_2;
  animID._M_string_length = 0;
  animID.field_2._M_local_buf[0] = '\0';
  channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  channels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  uVar5 = TestAttribute(this,"name");
  uVar6 = TestAttribute(this,"id");
  if ((int)uVar6 < 0) {
    if ((int)uVar5 < 0) {
      std::__cxx11::string::assign((char *)&animName);
      goto LAB_003f9ea7;
    }
  }
  else {
    (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
    std::__cxx11::string::assign((char *)&animID);
    if ((int)uVar5 < 0) {
      std::__cxx11::string::_M_assign((string *)&animName);
      goto LAB_003f9ea7;
    }
  }
  (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
  std::__cxx11::string::assign((char *)&animName);
LAB_003f9ea7:
  local_270 = (Animation *)&local_270->mSubAnims;
  local_264 = uVar6;
  do {
    while( true ) {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar4 == '\0') goto LAB_003fa1aa;
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 != 1) break;
      bVar3 = IsElement(this,"animation");
      if (bVar3) {
        if (anim == (Animation *)0x0) {
          anim = (Animation *)operator_new(0x50);
          (anim->mName)._M_dataplus._M_p = (pointer)&(anim->mName).field_2;
          (anim->mName)._M_string_length = 0;
          (anim->mName).field_2._M_local_buf[0] = '\0';
          (anim->mChannels).
          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (anim->mChannels).
          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (anim->mChannels).
          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (anim->mSubAnims).
          super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (anim->mSubAnims).
          super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (anim->mSubAnims).
          super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::_M_assign((string *)anim);
          std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
          push_back((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                     *)local_270,&anim);
        }
        ReadAnimation(this,anim);
      }
      else {
        bVar3 = IsElement(this,"source");
        if (bVar3) {
          ReadSource(this);
        }
        else {
          bVar3 = IsElement(this,"sampler");
          if (bVar3) {
            uVar5 = GetAttribute(this,"id");
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&id,(char *)CONCAT44(extraout_var,iVar4),
                       (allocator<char> *)&local_110);
            __s = &local_1f0.mTarget.field_2;
            memset(__s,0,0xb0);
            local_1f0.mTarget._M_string_length = 0;
            local_1f0.mSourceTimes._M_dataplus._M_p = (pointer)&local_1f0.mSourceTimes.field_2;
            local_1f0.mSourceTimes.field_2._M_local_buf[0] = '\0';
            local_1f0.mSourceValues._M_dataplus._M_p = (pointer)&local_1f0.mSourceValues.field_2;
            local_1f0.mSourceValues.field_2._M_local_buf[0] = '\0';
            local_1f0.mInTanValues._M_dataplus._M_p = (pointer)&local_1f0.mInTanValues.field_2;
            local_1f0.mInTanValues.field_2._M_local_buf[0] = '\0';
            local_1f0.mOutTanValues._M_dataplus._M_p = (pointer)&local_1f0.mOutTanValues.field_2;
            local_1f0.mOutTanValues.field_2._M_local_buf[0] = '\0';
            local_1f0.mInterpolationValues._M_dataplus._M_p =
                 (pointer)&local_1f0.mInterpolationValues.field_2;
            local_1f0.mInterpolationValues.field_2._M_local_buf[0] = '\0';
            local_1f0.mTarget._M_dataplus._M_p = (pointer)__s;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Assimp::Collada::AnimationChannel,_true>
                      (&local_110,&id,&local_1f0);
            pVar10 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>>
                     ::
                     _M_emplace_unique<std::pair<std::__cxx11::string,Assimp::Collada::AnimationChannel>>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>>
                                 *)&channels,&local_110);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>
            ::~pair(&local_110);
            Collada::AnimationChannel::~AnimationChannel(&local_1f0);
            ReadAnimationSampler(this,(AnimationChannel *)(pVar10.first._M_node._M_node + 2));
            std::__cxx11::string::~string((string *)&id);
          }
          else {
            bVar3 = IsElement(this,"channel");
            if (bVar3) {
              uVar5 = GetAttribute(this,"target");
              uVar6 = GetAttribute(this,"source");
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,
                         (char *)CONCAT44(extraout_var_00,iVar4) +
                         (*(char *)CONCAT44(extraout_var_00,iVar4) == '#'),
                         (allocator<char> *)&local_1f0);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                      ::find(&channels._M_t,&local_110.first);
              std::__cxx11::string::~string((string *)&local_110);
              if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
                (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
                std::__cxx11::string::assign((char *)(iVar7._M_node + 2));
              }
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
              if ((char)iVar4 == '\0') {
                SkipElement(this);
              }
            }
            else {
              SkipElement(this);
            }
          }
        }
      }
    }
    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar4 != 2);
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"animation");
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Expected end of <animation> element.",
               (allocator<char> *)&local_1f0);
    ThrowException(this,&local_110.first);
  }
LAB_003fa1aa:
  uVar5 = local_264;
  if (channels._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var8 = channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (anim == (Animation *)0x0) {
      anim = (Animation *)operator_new(0x50);
      (anim->mName)._M_dataplus._M_p = (pointer)&(anim->mName).field_2;
      (anim->mName)._M_string_length = 0;
      (anim->mName).field_2._M_local_buf[0] = '\0';
      (anim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (anim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (anim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (anim->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (anim->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (anim->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::_M_assign((string *)anim);
      std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
      push_back((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                 *)local_270,&anim);
      p_Var8 = channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    for (; pAVar2 = anim, (_Rb_tree_header *)p_Var8 != p_Var1;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      std::
      vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ::push_back(&anim->mChannels,(value_type *)(p_Var8 + 2));
    }
    if (-1 < (int)uVar5) {
      ppAVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>_>_>
                ::operator[](&this->mAnimationLibrary,&animID);
      *ppAVar9 = pAVar2;
    }
  }
  std::__cxx11::string::~string((string *)&animID);
  std::__cxx11::string::~string((string *)&animName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
  ::~_Rb_tree(&channels._M_t);
  return;
}

Assistant:

void ColladaParser::ReadAnimation(Collada::Animation* pParent)
{
    if (mReader->isEmptyElement())
        return;

    // an <animation> element may be a container for grouping sub-elements or an animation channel
    // this is the channel collection by ID, in case it has channels
    typedef std::map<std::string, AnimationChannel> ChannelMap;
    ChannelMap channels;
    // this is the anim container in case we're a container
    Animation* anim = NULL;

    // optional name given as an attribute
    std::string animName;
    std::string animID;
    int indexName = TestAttribute("name");
    int indexID = TestAttribute("id");

    if (indexID >= 0)
        animID = mReader->getAttributeValue(indexID);

    if (indexName >= 0)
        animName = mReader->getAttributeValue(indexName);
    else if (indexID >= 0)
        animName = animID;
    else
        animName = "animation";

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // we have subanimations
            if (IsElement("animation"))
            {
                // create container from our element
                if (!anim)
                {
                    anim = new Animation;
                    anim->mName = animName;
                    pParent->mSubAnims.push_back(anim);
                }

                // recurse into the subelement
                ReadAnimation(anim);
            }
            else if (IsElement("source"))
            {
                // possible animation data - we'll never know. Better store it
                ReadSource();
            }
            else if (IsElement("sampler"))
            {
                // read the ID to assign the corresponding collada channel afterwards.
                int indexID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(indexID);
                ChannelMap::iterator newChannel = channels.insert(std::make_pair(id, AnimationChannel())).first;

                // have it read into a channel
                ReadAnimationSampler(newChannel->second);
            }
            else if (IsElement("channel"))
            {
                // the binding element whose whole purpose is to provide the target to animate
                // Thanks, Collada! A directly posted information would have been too simple, I guess.
                // Better add another indirection to that! Can't have enough of those.
                int indexTarget = GetAttribute("target");
                int indexSource = GetAttribute("source");
                const char* sourceId = mReader->getAttributeValue(indexSource);
                if (sourceId[0] == '#')
                    sourceId++;
                ChannelMap::iterator cit = channels.find(sourceId);
                if (cit != channels.end())
                    cit->second.mTarget = mReader->getAttributeValue(indexTarget);

                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "animation") != 0)
                ThrowException("Expected end of <animation> element.");

            break;
        }
    }

    // it turned out to have channels - add them
    if (!channels.empty())
    {
        // FIXME: Is this essentially doing the same as "single-anim-node" codepath in
        //        ColladaLoader::StoreAnimations? For now, this has been deferred to after
        //        all animations and all clips have been read. Due to handling of
        //        <library_animation_clips> this cannot be done here, as the channel owner
        //        is lost, and some exporters make up animations by referring to multiple
        //        single-channel animations from an <instance_animation>.
/*
        // special filtering for stupid exporters packing each channel into a separate animation
        if( channels.size() == 1)
        {
            pParent->mChannels.push_back( channels.begin()->second);
        } else
*/
        {
            // else create the animation, if not done yet, and store the channels
            if (!anim)
            {
                anim = new Animation;
                anim->mName = animName;
                pParent->mSubAnims.push_back(anim);
            }
            for (ChannelMap::const_iterator it = channels.begin(); it != channels.end(); ++it)
                anim->mChannels.push_back(it->second);

            if (indexID >= 0)
            {
                mAnimationLibrary[animID] = anim;
            }
        }
    }
}